

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

int __thiscall pstore::file::file_handle::close(file_handle *this,int __fd)

{
  bool bVar1;
  int extraout_EAX;
  reference piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  error_code eVar3;
  string local_58 [32];
  uint local_38;
  error_category *local_30;
  undefined1 local_28 [8];
  error_or<int> file_or_error;
  file_handle *this_local;
  
  this->is_writable_ = false;
  file_or_error._16_8_ = this;
  close_noex((error_or<int> *)local_28,this->file_);
  bVar1 = error_or::operator_cast_to_bool((error_or *)local_28);
  if (!bVar1) {
    eVar3 = error_or<int>::get_error((error_or<int> *)local_28);
    local_30 = eVar3._M_cat;
    local_38 = eVar3._M_value;
    std::__cxx11::string::string(local_58,(string *)&this->path_);
    eVar3._M_cat = (error_category *)"Unable to close";
    eVar3._0_8_ = local_30;
    (anonymous_namespace)::raise_file_error<std::error_code,char_const*,std::__cxx11::string>
              ((_anonymous_namespace_ *)(ulong)local_38,eVar3,(char *)local_58,in_R8);
  }
  piVar2 = error_or<int>::operator*((error_or<int> *)local_28);
  this->file_ = *piVar2;
  error_or<int>::~error_or((error_or<int> *)local_28);
  return extraout_EAX;
}

Assistant:

void file_handle::close () {
            is_writable_ = false;
            auto file_or_error = file_handle::close_noex (file_);
            if (!file_or_error) {
                raise_file_error (file_or_error.get_error (), "Unable to close", path_);
            }
            file_ = *file_or_error;
        }